

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

void QUtil::pipe_file(char *filename,Pipeline *p)

{
  int iVar1;
  size_t sVar2;
  runtime_error *this;
  allocator<char> local_2089;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2088;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2068;
  undefined1 local_2038 [8];
  uchar buf [8192];
  int size;
  size_t len;
  FileCloser fc;
  FILE *f;
  Pipeline *p_local;
  char *filename_local;
  
  fc.f = safe_fopen(filename,"rb");
  FileCloser::FileCloser((FileCloser *)&len,fc.f);
  buf[0x1ffc] = '\0';
  buf[0x1ffd] = ' ';
  buf[0x1ffe] = '\0';
  buf[0x1fff] = '\0';
  while( true ) {
    sVar2 = fread(local_2038,1,0x2000,(FILE *)fc.f);
    if (sVar2 == 0) break;
    (*p->_vptr_Pipeline[2])(p,local_2038,sVar2);
  }
  (*p->_vptr_Pipeline[3])();
  iVar1 = ferror((FILE *)fc.f);
  if (iVar1 != 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2088,"failure reading file ",&local_2089);
    std::operator+(&local_2068,&local_2088,filename);
    std::runtime_error::runtime_error(this,(string *)&local_2068);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  FileCloser::~FileCloser((FileCloser *)&len);
  return;
}

Assistant:

void
QUtil::pipe_file(char const* filename, Pipeline* p)
{
    // Exercised in test suite by testing file_provider.
    FILE* f = safe_fopen(filename, "rb");
    FileCloser fc(f);
    size_t len = 0;
    int constexpr size = 8192;
    unsigned char buf[size];
    while ((len = fread(buf, 1, size, f)) > 0) {
        p->write(buf, len);
    }
    p->finish();
    if (ferror(f)) {
        throw std::runtime_error(std::string("failure reading file ") + filename);
    }
}